

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O3

uchar * __thiscall
QFSFileEnginePrivate::map(QFSFileEnginePrivate *this,qint64 offset,qint64 size,MemoryMapFlags flags)

{
  byte bVar1;
  uint uVar2;
  QFSFileEnginePrivate *this_00;
  Entry *pEVar3;
  int iVar4;
  int __fd;
  void *pvVar5;
  int *piVar6;
  uchar *puVar7;
  long lVar8;
  long in_FS_OFFSET;
  uchar *address;
  uchar *local_58;
  TryEmplaceResult local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFSFileEnginePrivate *)(this->super_QAbstractFileEnginePrivate).q_ptr;
  if ((this->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
      super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i == 0) {
    map(this_00);
  }
  else if ((offset < 0) || (size < 1)) {
    map(this_00);
  }
  else {
    doStat(this,(MetaDataFlags)0x200000);
    uVar2 = (this->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
            super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
    iVar4 = getpagesize();
    lVar8 = offset % (long)iVar4;
    if ((FILE *)this->fh == (FILE *)0x0) {
      __fd = this->fd;
    }
    else {
      __fd = fileno((FILE *)this->fh);
    }
    pvVar5 = mmap64((void *)0x0,size + lVar8,
                    ((uint)flags.super_QFlagsStorageHelper<QFileDevice::MemoryMapFlag,_4>.
                           super_QFlagsStorage<QFileDevice::MemoryMapFlag>.i & 1) * 2 | uVar2 & 3,
                    ((uint)flags.super_QFlagsStorageHelper<QFileDevice::MemoryMapFlag,_4>.
                           super_QFlagsStorage<QFileDevice::MemoryMapFlag>.i & 1) + 1,__fd,
                    -iVar4 & offset);
    if (pvVar5 != (void *)0xffffffffffffffff) {
      local_58 = (uchar *)((long)pvVar5 + lVar8);
      QHash<unsigned_char*,QFSFileEnginePrivate::StartAndLength>::
      tryEmplace_impl<unsigned_char*const&>
                (&local_50,(QHash<unsigned_char*,QFSFileEnginePrivate::StartAndLength> *)&this->maps
                 ,&local_58);
      pEVar3 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
      bVar1 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
              [(uint)local_50.iterator.i.bucket & 0x7f];
      *(int *)(pEVar3[bVar1].storage.data + 8) = (int)lVar8;
      *(qint64 *)(pEVar3[bVar1].storage.data + 0x10) = size + lVar8;
      puVar7 = local_58;
      goto LAB_00132ace;
    }
    piVar6 = __errno_location();
    iVar4 = *piVar6;
    if ((iVar4 == 0x17) || (iVar4 == 0xc)) {
      map();
    }
    else if (iVar4 == 9) {
      map(this_00);
    }
    else {
      map();
    }
  }
  puVar7 = (uchar *)0x0;
LAB_00132ace:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return puVar7;
  }
  __stack_chk_fail();
}

Assistant:

uchar *QFSFileEnginePrivate::map(qint64 offset, qint64 size, QFile::MemoryMapFlags flags)
{
    qint64 maxFileOffset = std::numeric_limits<QT_OFF_T>::max();
#if (defined(Q_OS_LINUX) || defined(Q_OS_ANDROID)) && Q_PROCESSOR_WORDSIZE == 4
    // The Linux mmap2 system call on 32-bit takes a page-shifted 32-bit
    // integer so the maximum offset is 1 << (32+12) (the shift is always 12,
    // regardless of the actual page size). Unfortunately, the mmap64()
    // function is known to be broken in all Linux libcs (glibc, uclibc, musl
    // and Bionic): all of them do the right shift, but don't confirm that the
    // result fits into the 32-bit parameter to the kernel.

    maxFileOffset = qMin((Q_INT64_C(1) << (32+12)) - 1, maxFileOffset);
#endif

    Q_Q(QFSFileEngine);
    if (openMode == QIODevice::NotOpen) {
        q->setError(QFile::PermissionsError, qt_error_string(EACCES));
        return nullptr;
    }

    if (offset < 0 || offset > maxFileOffset
        || size <= 0
        || quint64(size) > quint64(size_t(-1))) {
        q->setError(QFile::UnspecifiedError, qt_error_string(EINVAL));
        return nullptr;
    }
    // If we know the mapping will extend beyond EOF, fail early to avoid
    // undefined behavior. Otherwise, let mmap have its say.
    if (doStat(QFileSystemMetaData::SizeAttribute)
            && (QT_OFF_T(size) > metaData.size() - QT_OFF_T(offset)))
        qWarning("QFSFileEngine::map: Mapping a file beyond its size is not portable");

    int access = 0;
    if (openMode & QIODevice::ReadOnly) access |= PROT_READ;
    if (openMode & QIODevice::WriteOnly) access |= PROT_WRITE;

    int sharemode = MAP_SHARED;
    if (flags & QFileDevice::MapPrivateOption) {
        sharemode = MAP_PRIVATE;
        access |= PROT_WRITE;
    }

#if defined(Q_OS_INTEGRITY)
    int pageSize = sysconf(_SC_PAGESIZE);
#else
    int pageSize = getpagesize();
#endif
    int extra = offset % pageSize;

    if (quint64(size + extra) > quint64((size_t)-1)) {
        q->setError(QFile::UnspecifiedError, qt_error_string(EINVAL));
        return nullptr;
    }

    size_t realSize = (size_t)size + extra;
    QT_OFF_T realOffset = QT_OFF_T(offset);
    realOffset &= ~(QT_OFF_T(pageSize - 1));

    void *mapAddress = QT_MMAP((void*)nullptr, realSize,
                   access, sharemode, nativeHandle(), realOffset);
    if (MAP_FAILED != mapAddress) {
        uchar *address = extra + static_cast<uchar*>(mapAddress);
        maps[address] = {extra, realSize};
        return address;
    }

    switch(errno) {
    case EBADF:
        q->setError(QFile::PermissionsError, qt_error_string(EACCES));
        break;
    case ENFILE:
    case ENOMEM:
        q->setError(QFile::ResourceError, qt_error_string(errno));
        break;
    case EINVAL:
        // size are out of bounds
    default:
        q->setError(QFile::UnspecifiedError, qt_error_string(errno));
        break;
    }
    return nullptr;
}